

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<double>::AddSameStruct(TPZSkylMatrix<double> *this,TPZSkylMatrix<double> *B,double k)

{
  double dVar1;
  int64_t iVar2;
  double *pdVar3;
  long in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  int64_t i;
  int64_t n;
  undefined8 local_28;
  
  iVar2 = TPZVec<double>::NElements((TPZVec<double> *)(in_RDI + 0x40));
  for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
    pdVar3 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RSI + 0x40),local_28);
    dVar1 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x40),local_28);
    *pdVar3 = in_XMM0_Qa * dVar1 + *pdVar3;
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::AddSameStruct(TPZSkylMatrix<TVar> &B, double k){
#ifdef PZDEBUG
	{
		int64_t size = this->fElem.NElements();
		if(size != B.fElem.NElements()){
			PZError << "\nFATAL ERROR at " << __PRETTY_FUNCTION__ << "\n";
			PZError.flush();
			DebugStop();
		}
		for(int64_t i = 0; i < size; i++){
			if((this->fElem[i]-this->fElem[0]) != (B.fElem[i]-B.fElem[0])){
				PZError << "\nFATAL ERROR at " << __PRETTY_FUNCTION__ << "\n";
				PZError.flush();
				DebugStop();
			}
		}
	}
#endif
	
	const int64_t n = this->fStorage.NElements();
	for(int64_t i = 0L; i < n; i++) this->fStorage[i] += TVar(k)*B.fStorage[i];
	
}